

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDarLcorr(Abc_Ntk_t *pNtk,int nFramesP,int nConfMax,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  pAVar1 = (Abc_Ntk_t *)0x0;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig != (Aig_Man_t *)0x0) {
    pAVar1 = (Abc_Ntk_t *)0x0;
    pMan = Fra_FraigLatchCorrespondence(pAig,nFramesP,nConfMax,0,fVerbose,(int *)0x0,0.0);
    Aig_ManStop(pAig);
    if (pMan != (Aig_Man_t *)0x0) {
      if (pMan->nRegs < pNtk->nObjCounts[8]) {
        pAVar1 = Abc_NtkFromDarSeqSweep(pNtk,pMan);
      }
      else {
        pAVar1 = Abc_NtkFromDar(pNtk,pMan);
        pVVar2 = pAVar1->vBoxes;
        if (0 < pVVar2->nSize) {
          lVar3 = 0;
          do {
            if ((*(uint *)((long)pVVar2->pArray[lVar3] + 0x14) & 0xf) == 8) {
              *(undefined8 *)((long)pVVar2->pArray[lVar3] + 0x38) = 1;
              pVVar2 = pAVar1->vBoxes;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < pVVar2->nSize);
        }
      }
      Aig_ManStop(pMan);
    }
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarLcorr( Abc_Ntk_t * pNtk, int nFramesP, int nConfMax, int fVerbose )
{
    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig = NULL;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    pMan = Fra_FraigLatchCorrespondence( pTemp = pMan, nFramesP, nConfMax, 0, fVerbose, NULL, 0.0 );
    Aig_ManStop( pTemp );
    if ( pMan )
    {
        if ( Aig_ManRegNum(pMan) < Abc_NtkLatchNum(pNtk) )
            pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
        else
        {
            Abc_Obj_t * pObj;
            int i;
            pNtkAig = Abc_NtkFromDar( pNtk, pMan );
            Abc_NtkForEachLatch( pNtkAig, pObj, i )
                Abc_LatchSetInit0( pObj );
        }
        Aig_ManStop( pMan );
    }
    return pNtkAig;
}